

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  double *i_1;
  ostream *poVar2;
  pointer pdVar3;
  iterator __end1;
  double *i;
  double *pdVar4;
  ulong uVar5;
  double *i_2;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> criteria;
  allocator_type local_71;
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0x4010000000000000;
  uStack_40 = 0x4000000000000000;
  local_58 = 8.0;
  uStack_50 = 0x4014000000000000;
  __l._M_len = 4;
  __l._M_array = &local_58;
  std::vector<double,_std::allocator<double>_>::vector(&local_70,__l,&local_71);
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar5 = 0;
    do {
      switch(uVar5) {
      case 0:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
        if (uVar5 == 3) goto switchD_00103d03_caseD_3;
        if (uVar5 == 2) goto switchD_00103d03_caseD_2;
        if (uVar5 == 1) goto switchD_00103d03_caseD_1;
        break;
      case 1:
switchD_00103d03_caseD_1:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Expenses for service: ",0x16);
        if (uVar5 == 3) goto switchD_00103d03_caseD_3;
        if (uVar5 == 2) goto switchD_00103d03_caseD_2;
        break;
      case 2:
switchD_00103d03_caseD_2:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Gas consumption: ",0x11);
        if (uVar5 == 3) goto switchD_00103d03_caseD_3;
        break;
      case 3:
switchD_00103d03_caseD_3:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comfort: ",9);
      }
      poVar2 = std::ostream::_M_insert<double>
                         (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar5]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_70.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_70.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  dVar1 = 0.0;
  for (pdVar4 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      pdVar4 != local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    dVar1 = dVar1 + *pdVar4;
  }
  for (; pdVar3 != local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
    *pdVar3 = *pdVar3 / dVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Normalized vector { ",0x14);
  for (pdVar4 = local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
    poVar2 = std::ostream::_M_insert<double>(*pdVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
  setMarks();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nReplacing criteria with restrictions\n",0x28);
  criteria_change();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nFormation and narrowing of the Parreto set\n",0x2e);
  Pareto();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nWeighting and combining criteria\n",0x24);
  Enum();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\n\nHeirarchies\n",0xf);
  Hierarchies();
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    vector<double> criteria={8,5,4,2};
    for(size_t i=0;i<criteria.size();i++){
        if(i==0)
            cout << "Cost: ";
        if(i==1)
            cout << "Expenses for service: ";
        if(i==2)
            cout << "Gas consumption: ";
        if(i==3)
            cout << "Comfort: ";
        cout << criteria[i] << endl;
    }
    normalize(criteria);
    cout << "Normalized vector { ";
    for(const double &i : criteria)
        cout << setprecision(3) << i << " ";

    cout << "}\n";

    setMarks();

    cout << "\n\n\nReplacing criteria with restrictions\n";
    criteria_change();

    cout << "\n\n\nFormation and narrowing of the Parreto set\n";
    Pareto();

    cout << "\n\n\nWeighting and combining criteria\n";
    Enum();

    cout << "\n\n\nHeirarchies\n";
    Hierarchies();
}